

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O1

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantGraphicsTestInstance::createQuad
          (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           *__return_storage_ptr__,PushConstantGraphicsTestInstance *this,float size)

{
  Vertex4RGBA UpperLeftVertex;
  Vertex4RGBA lowerRightVertex;
  Vertex4RGBA UpperRightVertex;
  Vertex4RGBA lowerLeftVertex;
  value_type local_90;
  value_type local_70;
  value_type local_50;
  value_type local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.position.m_data[0] = -size;
  local_30.position.m_data[2] = 0.0;
  local_30.position.m_data[3] = 1.0;
  local_30.color.m_data[0] = 1.0;
  local_30.color.m_data[1] = 0.0;
  local_30.color.m_data[2] = 0.0;
  local_30.color.m_data[3] = 1.0;
  local_70.position.m_data[2] = 0.0;
  local_70.position.m_data[3] = 1.0;
  local_70.color.m_data[0] = 1.0;
  local_70.color.m_data[1] = 0.0;
  local_70.color.m_data[2] = 0.0;
  local_70.color.m_data[3] = 1.0;
  local_90.position.m_data[2] = 0.0;
  local_90.position.m_data[3] = 1.0;
  local_90.color.m_data[0] = 1.0;
  local_90.color.m_data[1] = 0.0;
  local_90.color.m_data[2] = 0.0;
  local_90.color.m_data[3] = 1.0;
  local_50.position.m_data[2] = 0.0;
  local_50.position.m_data[3] = 1.0;
  local_50.color.m_data[0] = 1.0;
  local_50.color.m_data[1] = 0.0;
  local_50.color.m_data[2] = 0.0;
  local_50.color.m_data[3] = 1.0;
  local_90.position.m_data[1] = size;
  local_70.position.m_data[0] = size;
  local_70.position.m_data[1] = local_90.position.m_data[0];
  local_50.position.m_data[0] = size;
  local_50.position.m_data[1] = size;
  local_30.position.m_data[0] = local_90.position.m_data[0];
  local_30.position.m_data[1] = local_90.position.m_data[0];
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,&local_30);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,&local_70);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,&local_90);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,&local_90);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,&local_70);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
            (__return_storage_ptr__,&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4RGBA> PushConstantGraphicsTestInstance::createQuad(const float size)
{
	std::vector<Vertex4RGBA>	vertices;

	const tcu::Vec4				color				= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const Vertex4RGBA			lowerLeftVertex		= {tcu::Vec4(-size, -size, 0.0f, 1.0f), color};
	const Vertex4RGBA			lowerRightVertex	= {tcu::Vec4(size, -size, 0.0f, 1.0f), color};
	const Vertex4RGBA			UpperLeftVertex		= {tcu::Vec4(-size, size, 0.0f, 1.0f), color};
	const Vertex4RGBA			UpperRightVertex	= {tcu::Vec4(size, size, 0.0f, 1.0f), color};

	vertices.push_back(lowerLeftVertex);
	vertices.push_back(lowerRightVertex);
	vertices.push_back(UpperLeftVertex);
	vertices.push_back(UpperLeftVertex);
	vertices.push_back(lowerRightVertex);
	vertices.push_back(UpperRightVertex);

	return vertices;
}